

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

void __thiscall serial::Serial::flushOutput(Serial *this)

{
  ScopedWriteLock local_18;
  ScopedWriteLock lock;
  Serial *this_local;
  
  lock.pimpl_ = (SerialImpl *)this;
  ScopedWriteLock::ScopedWriteLock(&local_18,this->pimpl_);
  SerialImpl::flushOutput(this->pimpl_);
  ScopedWriteLock::~ScopedWriteLock(&local_18);
  return;
}

Assistant:

void Serial::flushOutput ()
{
  ScopedWriteLock lock(this->pimpl_);
  pimpl_->flushOutput ();
}